

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valtype.h
# Opt level: O0

LatticeComparison __thiscall wasm::analysis::ValType::compare(ValType *this,Element a,Element b)

{
  bool bVar1;
  byte local_5e;
  byte local_5b;
  BasicType local_44;
  ValType *local_40;
  uintptr_t local_38;
  BasicType local_2c;
  ValType *local_28;
  ValType *this_local;
  Element b_local;
  Element a_local;
  
  local_28 = this;
  this_local = (ValType *)b.id;
  b_local = a;
  bVar1 = Type::operator==(&b_local,(Type *)&this_local);
  if (bVar1) {
    a_local.id._4_4_ = EQUAL;
  }
  else {
    local_2c = none;
    bVar1 = Type::operator==((Type *)&this_local,&local_2c);
    local_5b = 1;
    if (!bVar1) {
      local_38 = b_local.id;
      local_40 = this_local;
      local_5b = wasm::Type::isSubType((Type)b_local.id,(Type)this_local);
    }
    if ((local_5b & 1) == 0) {
      local_44 = none;
      bVar1 = Type::operator==(&b_local,&local_44);
      local_5e = 1;
      if (!bVar1) {
        local_5e = wasm::Type::isSubType((Type)this_local,(Type)b_local.id);
      }
      if ((local_5e & 1) == 0) {
        a_local.id._4_4_ = NO_RELATION;
      }
      else {
        a_local.id._4_4_ = GREATER;
      }
    }
    else {
      a_local.id._4_4_ = LESS;
    }
  }
  return a_local.id._4_4_;
}

Assistant:

LatticeComparison compare(Element a, Element b) const noexcept {
    if (a == b) {
      return EQUAL;
    }
    if (b == Type::none || Type::isSubType(a, b)) {
      return LESS;
    }
    if (a == Type::none || Type::isSubType(b, a)) {
      return GREATER;
    }
    return NO_RELATION;
  }